

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model.cpp
# Opt level: O0

void __thiscall
llm_build_command_r::llm_build_command_r
          (llm_build_command_r *this,llama_model *model,llm_graph_params *params,ggml_cgraph *gf)

{
  float fVar1;
  uint uVar2;
  undefined8 uVar3;
  ggml_tensor *pgVar4;
  ggml_tensor *q_cur;
  ggml_tensor *kq_b;
  ggml_tensor *pgVar5;
  const_reference pvVar6;
  ggml_tensor *pgVar7;
  ggml_tensor *pgVar8;
  ggml_tensor *act_scales;
  ggml_tensor *pgVar9;
  pointer plVar10;
  llama_cross *in_RCX;
  long in_RSI;
  ggml_cgraph *in_RDI;
  ggml_tensor *attn_out;
  ggml_tensor *inp_out_ids;
  ggml_tensor *Vcur;
  ggml_tensor *Kcur;
  ggml_tensor *Qcur;
  ggml_tensor *ffn_inp;
  int il;
  llm_graph_input_attn_kv_unified *inp_attn;
  ggml_tensor *inp_pos;
  ggml_tensor *inpL;
  ggml_tensor *cur;
  float f_logit_scale;
  int64_t n_embd_head;
  ggml_tensor *in_stack_fffffffffffffd78;
  int iVar11;
  llama_hparams *in_stack_fffffffffffffd80;
  ggml_tensor *in_stack_fffffffffffffd88;
  ggml_tensor *in_stack_fffffffffffffd90;
  ggml_tensor *in_stack_fffffffffffffd98;
  llm_graph_context *in_stack_fffffffffffffda0;
  ggml_tensor *in_stack_fffffffffffffdd0;
  ggml_tensor *in_stack_fffffffffffffdd8;
  llm_graph_context *in_stack_fffffffffffffde0;
  ggml_tensor *in_stack_fffffffffffffdf8;
  ggml_tensor *in_stack_fffffffffffffe00;
  llm_graph_context *in_stack_fffffffffffffe20;
  ggml_tensor *in_stack_fffffffffffffe30;
  ggml_tensor *in_stack_fffffffffffffe38;
  ggml_tensor *in_stack_fffffffffffffe40;
  ggml_tensor *in_stack_fffffffffffffe48;
  llm_ffn_op_type type_op;
  llm_ffn_gate_type type_gate;
  llama_cross *plVar12;
  ggml_tensor *in_stack_fffffffffffffe88;
  llm_graph_context *in_stack_fffffffffffffe90;
  float kq_scale;
  ggml_tensor *wo;
  ggml_tensor *in_stack_ffffffffffffff68;
  ggml_tensor *in_stack_ffffffffffffff70;
  ggml_tensor *local_88;
  undefined4 in_stack_ffffffffffffff98;
  int iVar13;
  ggml_tensor *pgVar14;
  ggml_tensor *local_50;
  ggml_tensor *local_48;
  
  llm_graph_context::llm_graph_context
            ((llm_graph_context *)in_stack_fffffffffffffd90,
             (llm_graph_params *)in_stack_fffffffffffffd88);
  uVar2 = *(uint *)(*(long *)(in_RDI + 8) + 0x24);
  if (uVar2 == *(uint *)(*(long *)(in_RDI + 8) + 0x20)) {
    fVar1 = *(float *)(*(long *)(in_RDI + 8) + 0x18f4);
    local_50 = llm_graph_context::build_inp_embd
                         (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
    wo = local_50;
    pgVar4 = llm_graph_context::build_inp_pos(in_stack_fffffffffffffde0);
    pgVar9 = pgVar4;
    q_cur = (ggml_tensor *)llm_graph_context::build_attn_inp_kv_unified(in_stack_fffffffffffffe20);
    pgVar14 = q_cur;
    for (iVar13 = 0; iVar11 = (int)((ulong)in_stack_fffffffffffffd78 >> 0x20),
        (long)iVar13 < *(long *)(in_RDI + 0x28); iVar13 = iVar13 + 1) {
      std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)iVar13
                );
      kq_b = llm_graph_context::build_norm
                       (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                        in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
                        (llm_norm_type)((ulong)in_stack_fffffffffffffd80 >> 0x20),
                        (int)in_stack_fffffffffffffd80);
      pgVar5 = kq_b;
      llm_graph_context::cb
                ((llm_graph_context *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
                 &in_stack_fffffffffffffd80->vocab_only,iVar11);
      kq_scale = (float)((ulong)pgVar5 >> 0x20);
      std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)iVar13
                );
      pgVar5 = llm_graph_context::build_lora_mm
                         (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
                          in_stack_fffffffffffffdd0);
      llm_graph_context::cb
                ((llm_graph_context *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
                 &in_stack_fffffffffffffd80->vocab_only,iVar11);
      pvVar6 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                         ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                          (long)iVar13);
      if (pvVar6->bq != (ggml_tensor *)0x0) {
        uVar3 = *(undefined8 *)(in_RDI + 0xc0);
        pvVar6 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                           ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                            (long)iVar13);
        pgVar5 = (ggml_tensor *)ggml_add(uVar3,pgVar5,pvVar6->bq);
        llm_graph_context::cb
                  ((llm_graph_context *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
                   &in_stack_fffffffffffffd80->vocab_only,iVar11);
      }
      std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)iVar13
                );
      pgVar7 = llm_graph_context::build_lora_mm
                         (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
                          in_stack_fffffffffffffdd0);
      llm_graph_context::cb
                ((llm_graph_context *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
                 &in_stack_fffffffffffffd80->vocab_only,iVar11);
      pvVar6 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                         ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                          (long)iVar13);
      if (pvVar6->bk != (ggml_tensor *)0x0) {
        uVar3 = *(undefined8 *)(in_RDI + 0xc0);
        pvVar6 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                           ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                            (long)iVar13);
        pgVar7 = (ggml_tensor *)ggml_add(uVar3,pgVar7,pvVar6->bk);
        llm_graph_context::cb
                  ((llm_graph_context *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
                   &in_stack_fffffffffffffd80->vocab_only,iVar11);
      }
      std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)iVar13
                );
      local_88 = llm_graph_context::build_lora_mm
                           (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
                            in_stack_fffffffffffffdd0);
      llm_graph_context::cb
                ((llm_graph_context *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
                 &in_stack_fffffffffffffd80->vocab_only,iVar11);
      pvVar6 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                         ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                          (long)iVar13);
      if (pvVar6->bv != (ggml_tensor *)0x0) {
        uVar3 = *(undefined8 *)(in_RDI + 0xc0);
        pvVar6 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                           ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                            (long)iVar13);
        local_88 = (ggml_tensor *)ggml_add(uVar3,local_88,pvVar6->bv);
        llm_graph_context::cb
                  ((llm_graph_context *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
                   &in_stack_fffffffffffffd80->vocab_only,iVar11);
      }
      pgVar5 = (ggml_tensor *)
               ggml_reshape_3d(*(undefined8 *)(in_RDI + 0xc0),pgVar5,uVar2,
                               *(undefined8 *)(in_RDI + 0x48),(long)*(int *)(in_RDI + 0xa8));
      pgVar8 = (ggml_tensor *)
               ggml_reshape_3d(*(undefined8 *)(in_RDI + 0xc0),pgVar7,uVar2,
                               *(undefined8 *)(in_RDI + 0x50),(long)*(int *)(in_RDI + 0xa8));
      pgVar7 = (ggml_tensor *)
               ggml_reshape_3d(*(undefined8 *)(in_RDI + 0xc0),local_88,uVar2,
                               *(undefined8 *)(in_RDI + 0x50),(long)*(int *)(in_RDI + 0xa8));
      pvVar6 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                         ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                          (long)iVar13);
      if (pvVar6->attn_q_norm != (ggml_tensor *)0x0) {
        std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                  ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                   (long)iVar13);
        pgVar5 = llm_graph_context::build_norm
                           (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                            in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
                            (llm_norm_type)((ulong)in_stack_fffffffffffffd80 >> 0x20),
                            (int)in_stack_fffffffffffffd80);
        llm_graph_context::cb
                  ((llm_graph_context *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
                   &in_stack_fffffffffffffd80->vocab_only,iVar11);
      }
      pgVar5 = (ggml_tensor *)
               ggml_rope_ext(*(undefined4 *)(in_RDI + 0x88),*(undefined4 *)(in_RDI + 0x8c),
                             *(undefined4 *)(in_RDI + 0x90),*(undefined4 *)(in_RDI + 0x94),
                             *(undefined4 *)(in_RDI + 0x98),*(undefined4 *)(in_RDI + 0x9c),
                             *(undefined8 *)(in_RDI + 0xc0),pgVar5,pgVar4,0,
                             *(undefined4 *)(in_RDI + 0x30),*(undefined4 *)(in_RDI + 0xb8));
      pvVar6 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                         ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                          (long)iVar13);
      if (pvVar6->attn_k_norm != (ggml_tensor *)0x0) {
        std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                  ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                   (long)iVar13);
        pgVar8 = llm_graph_context::build_norm
                           (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                            in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
                            (llm_norm_type)((ulong)in_stack_fffffffffffffd80 >> 0x20),
                            (int)in_stack_fffffffffffffd80);
        llm_graph_context::cb
                  ((llm_graph_context *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
                   &in_stack_fffffffffffffd80->vocab_only,iVar11);
      }
      act_scales = (ggml_tensor *)
                   ggml_rope_ext(*(undefined4 *)(in_RDI + 0x88),*(undefined4 *)(in_RDI + 0x8c),
                                 *(undefined4 *)(in_RDI + 0x90),*(undefined4 *)(in_RDI + 0x94),
                                 *(undefined4 *)(in_RDI + 0x98),*(undefined4 *)(in_RDI + 0x9c),
                                 *(undefined8 *)(in_RDI + 0xc0),pgVar8,pgVar4,0,
                                 *(undefined4 *)(in_RDI + 0x30),*(undefined4 *)(in_RDI + 0xb8));
      llm_graph_context::cb
                ((llm_graph_context *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
                 &in_stack_fffffffffffffd80->vocab_only,iVar11);
      llm_graph_context::cb
                ((llm_graph_context *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
                 &in_stack_fffffffffffffd80->vocab_only,iVar11);
      llm_graph_context::cb
                ((llm_graph_context *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
                 &in_stack_fffffffffffffd80->vocab_only,iVar11);
      type_op = (llm_ffn_op_type)pgVar14;
      plVar12 = in_RCX;
      pvVar6 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                         ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                          (long)iVar13);
      type_gate = (llm_ffn_gate_type)plVar12;
      iVar11 = (int)pvVar6->wo;
      std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)iVar13
                );
      pgVar8 = act_scales;
      sqrtf((float)uVar2);
      local_48 = llm_graph_context::build_attn
                           ((llm_graph_context *)in_stack_ffffffffffffff70,
                            (llm_graph_input_attn_kv_unified *)in_stack_ffffffffffffff68,in_RDI,wo,
                            pgVar9,q_cur,pgVar8,pgVar5,kq_b,
                            (ggml_tensor *)CONCAT44(iVar13,in_stack_ffffffffffffff98),kq_scale,
                            (int)pgVar14);
      if ((long)iVar13 == *(long *)(in_RDI + 0x28) + -1) {
        in_stack_fffffffffffffe48 =
             llm_graph_context::build_inp_out_ids((llm_graph_context *)in_stack_fffffffffffffdd0);
        in_stack_ffffffffffffff70 = in_stack_fffffffffffffe48;
        local_48 = (ggml_tensor *)
                   ggml_get_rows(*(undefined8 *)(in_RDI + 0xc0),local_48,in_stack_fffffffffffffe48);
        in_stack_fffffffffffffe40 = local_48;
        local_50 = (ggml_tensor *)
                   ggml_get_rows(*(undefined8 *)(in_RDI + 0xc0),local_50,in_stack_ffffffffffffff70);
        in_stack_fffffffffffffe38 = local_50;
        in_stack_fffffffffffffe30 =
             (ggml_tensor *)
             ggml_get_rows(*(undefined8 *)(in_RDI + 0xc0),kq_b,in_stack_ffffffffffffff70);
        kq_b = in_stack_fffffffffffffe30;
      }
      pvVar6 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                         ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                          (long)iVar13);
      pgVar5 = pvVar6->ffn_up;
      pvVar6 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                         ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                          (long)iVar13);
      pgVar8 = pvVar6->ffn_gate;
      pvVar6 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                         ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                          (long)iVar13);
      in_stack_fffffffffffffd88 = pvVar6->ffn_down;
      in_stack_fffffffffffffda0 = (llm_graph_context *)0x0;
      in_stack_fffffffffffffd98 = (ggml_tensor *)0x0;
      in_stack_fffffffffffffd90 = (ggml_tensor *)0x0;
      in_stack_fffffffffffffd80 = (llama_hparams *)0x0;
      in_stack_fffffffffffffd78 = (ggml_tensor *)0x0;
      pgVar5 = llm_graph_context::build_ffn
                         ((llm_graph_context *)&stack0xfffffffffffffd78,pgVar8,pgVar5,kq_b,
                          in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
                          in_stack_fffffffffffffe30,in_stack_fffffffffffffe38,
                          in_stack_fffffffffffffe40,in_stack_fffffffffffffe48,pgVar7,act_scales,
                          type_op,type_gate,iVar11);
      llm_graph_context::cb
                ((llm_graph_context *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
                 &in_stack_fffffffffffffd80->vocab_only,
                 (int)((ulong)in_stack_fffffffffffffd78 >> 0x20));
      in_stack_fffffffffffffe00 =
           (ggml_tensor *)ggml_add(*(undefined8 *)(in_RDI + 0xc0),pgVar5,local_50);
      in_stack_fffffffffffffdf8 =
           (ggml_tensor *)
           ggml_add(*(undefined8 *)(in_RDI + 0xc0),in_stack_fffffffffffffe00,local_48);
      local_50 = llm_graph_context::build_cvec
                           ((llm_graph_context *)in_stack_fffffffffffffd80,in_stack_fffffffffffffd78
                            ,0);
      llm_graph_context::cb
                ((llm_graph_context *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
                 &in_stack_fffffffffffffd80->vocab_only,
                 (int)((ulong)in_stack_fffffffffffffd78 >> 0x20));
      in_stack_ffffffffffffff68 = local_48;
    }
    pgVar9 = llm_graph_context::build_norm
                       (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                        in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
                        (llm_norm_type)((ulong)in_stack_fffffffffffffd80 >> 0x20),
                        (int)in_stack_fffffffffffffd80);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
               &in_stack_fffffffffffffd80->vocab_only,iVar11);
    plVar10 = std::unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_>::operator->
                        ((unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_> *)
                         0x4e2598);
    plVar10->t_embd = pgVar9;
    local_48 = llm_graph_context::build_lora_mm
                         (in_stack_fffffffffffffde0,pgVar9,in_stack_fffffffffffffdd0);
    if ((fVar1 != 0.0) || (NAN(fVar1))) {
      local_48 = (ggml_tensor *)ggml_scale(fVar1,*(undefined8 *)(in_RDI + 0xc0),local_48);
    }
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
               &in_stack_fffffffffffffd80->vocab_only,iVar11);
    plVar10 = std::unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_>::operator->
                        ((unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_> *)
                         0x4e266b);
    plVar10->t_logits = local_48;
    ggml_build_forward_expand(in_RCX,local_48);
    return;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model.cpp"
             ,0x2258,"GGML_ASSERT(%s) failed","n_embd_head == hparams.n_embd_head_k");
}

Assistant:

llm_build_command_r(const llama_model & model, const llm_graph_params & params, ggml_cgraph * gf) : llm_graph_context(params) {
        const int64_t n_embd_head = hparams.n_embd_head_v;

        GGML_ASSERT(n_embd_head == hparams.n_embd_head_k);

        const float f_logit_scale = hparams.f_logit_scale;

        ggml_tensor * cur;
        ggml_tensor * inpL;

        inpL = build_inp_embd(model.tok_embd);

        // inp_pos - contains the positions
        ggml_tensor * inp_pos = build_inp_pos();

        auto * inp_attn = build_attn_inp_kv_unified();

        for (int il = 0; il < n_layer; ++il) {

            // norm
            cur = build_norm(inpL,
                    model.layers[il].attn_norm, NULL,
                    LLM_NORM, il);
            cb(cur, "attn_norm", il);
            ggml_tensor * ffn_inp = cur;

            // self-attention
            {
                // compute Q and K and RoPE them
                ggml_tensor * Qcur = build_lora_mm(model.layers[il].wq, cur);
                cb(Qcur, "Qcur", il);
                if (model.layers[il].bq) {
                    Qcur = ggml_add(ctx0, Qcur, model.layers[il].bq);
                    cb(Qcur, "Qcur", il);
                }

                ggml_tensor * Kcur = build_lora_mm(model.layers[il].wk, cur);
                cb(Kcur, "Kcur", il);
                if (model.layers[il].bk) {
                    Kcur = ggml_add(ctx0, Kcur, model.layers[il].bk);
                    cb(Kcur, "Kcur", il);
                }

                ggml_tensor * Vcur = build_lora_mm(model.layers[il].wv, cur);
                cb(Vcur, "Vcur", il);
                if (model.layers[il].bv) {
                    Vcur = ggml_add(ctx0, Vcur, model.layers[il].bv);
                    cb(Vcur, "Vcur", il);
                }

                Qcur = ggml_reshape_3d(ctx0, Qcur, n_embd_head, n_head,    n_tokens);
                Kcur = ggml_reshape_3d(ctx0, Kcur, n_embd_head, n_head_kv, n_tokens);
                Vcur = ggml_reshape_3d(ctx0, Vcur, n_embd_head, n_head_kv, n_tokens);

                if (model.layers[il].attn_q_norm) {
                    Qcur = build_norm(Qcur,
                            model.layers[il].attn_q_norm,
                            NULL,
                            LLM_NORM, il);
                    cb(Qcur, "Qcur", il);
                }

                Qcur = ggml_rope_ext(
                        ctx0, Qcur, inp_pos, nullptr,
                        n_rot, rope_type, n_ctx_orig, freq_base, freq_scale,
                        ext_factor, attn_factor, beta_fast, beta_slow
                        );

                if (model.layers[il].attn_k_norm) {
                    Kcur = build_norm(Kcur,
                            model.layers[il].attn_k_norm,
                            NULL,
                            LLM_NORM, il);
                    cb(Kcur, "Kcur", il);
                }

                Kcur = ggml_rope_ext(
                        ctx0, Kcur, inp_pos, nullptr,
                        n_rot, rope_type, n_ctx_orig, freq_base, freq_scale,
                        ext_factor, attn_factor, beta_fast, beta_slow
                        );

                cb(Qcur, "Qcur", il);
                cb(Kcur, "Kcur", il);
                cb(Vcur, "Vcur", il);

                cur = build_attn(inp_attn, gf,
                        model.layers[il].wo, model.layers[il].bo,
                        Qcur, Kcur, Vcur, nullptr, nullptr, 1.0f/sqrtf(float(n_embd_head)), il);
            }

            if (il == n_layer - 1) {
                // skip computing output for unused tokens
                ggml_tensor * inp_out_ids = build_inp_out_ids();
                cur     = ggml_get_rows(ctx0,     cur, inp_out_ids);
                inpL    = ggml_get_rows(ctx0,    inpL, inp_out_ids);
                ffn_inp = ggml_get_rows(ctx0, ffn_inp, inp_out_ids);
            }

            ggml_tensor * attn_out = cur;

            // feed-forward network
            {
                cur = build_ffn(ffn_inp,
                        model.layers[il].ffn_up,   NULL, NULL,
                        model.layers[il].ffn_gate, NULL, NULL,
                        model.layers[il].ffn_down, NULL, NULL,
                        NULL,
                        LLM_FFN_SILU, LLM_FFN_PAR, il);
                cb(cur, "ffn_out", il);
            }

            // add together residual + FFN + self-attention
            cur = ggml_add(ctx0, cur, inpL);
            cur = ggml_add(ctx0, cur, attn_out);

            cur = build_cvec(cur, il);
            cb(cur, "l_out", il);

            // input for next layer
            inpL = cur;
        }

        cur = inpL;

        cur = build_norm(cur,
                model.output_norm, NULL,
                LLM_NORM, -1);

        cb(cur, "result_norm", -1);
        res->t_embd = cur;

        // lm_head
        cur = build_lora_mm(model.output, cur);

        if (f_logit_scale) {
            cur = ggml_scale(ctx0, cur, f_logit_scale);
        }

        cb(cur, "result_output", -1);
        res->t_logits = cur;

        ggml_build_forward_expand(gf, cur);
    }